

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fRandomFragmentOpTests.cpp
# Opt level: O0

void deqp::gles3::Functional::translateState
               (RenderState *src,FragmentOperationState *dst,RenderTarget *renderTarget)

{
  BlendState *pBVar1;
  int iVar2;
  TestFunc TVar3;
  byte local_56;
  byte local_55;
  Vector<float,_4> local_54;
  Vector<float,_4> local_44;
  undefined8 local_34;
  undefined8 local_2c;
  undefined1 local_22;
  byte local_21;
  bool hasStencil;
  RenderTarget *pRStack_20;
  bool hasDepth;
  RenderTarget *renderTarget_local;
  FragmentOperationState *dst_local;
  RenderState *src_local;
  
  pRStack_20 = renderTarget;
  renderTarget_local = (RenderTarget *)dst;
  dst_local = (FragmentOperationState *)src;
  iVar2 = tcu::RenderTarget::getDepthBits(renderTarget);
  local_21 = 0 < iVar2;
  iVar2 = tcu::RenderTarget::getStencilBits(pRStack_20);
  local_22 = 0 < iVar2;
  *(byte *)&renderTarget_local->m_width = dst_local->scissorTestEnabled & 1;
  iVar2 = (dst_local->scissorRectangle).bottom;
  renderTarget_local->m_height = (dst_local->scissorRectangle).left;
  (renderTarget_local->m_pixelFormat).redBits = iVar2;
  iVar2 = (dst_local->scissorRectangle).height;
  (renderTarget_local->m_pixelFormat).greenBits = (dst_local->scissorRectangle).width;
  (renderTarget_local->m_pixelFormat).blueBits = iVar2;
  local_55 = 0;
  if ((bool)local_22) {
    local_55 = dst_local->stencilTestEnabled;
  }
  *(byte *)&(renderTarget_local->m_pixelFormat).alphaBits = local_55 & 1;
  local_56 = 0;
  if ((local_21 & 1) != 0) {
    local_56 = dst_local->depthTestEnabled;
  }
  *(byte *)&renderTarget_local[2].m_pixelFormat.redBits = local_56 & 1;
  renderTarget_local[2].m_pixelFormat.alphaBits = (uint)((dst_local->field_0x59 & 1) != 0);
  iVar2 = tcu::RenderTarget::getStencilBits(pRStack_20);
  renderTarget_local[4].m_pixelFormat.greenBits = iVar2;
  renderTarget_local[4].m_pixelFormat.redBits = *(int *)((long)(dst_local->blendColor).m_data + 0xd)
  ;
  if ((renderTarget_local[2].m_pixelFormat.redBits & 1) != 0) {
    TVar3 = sglr::rr_util::mapGLTestFunc(dst_local->depthFunc);
    renderTarget_local[2].m_pixelFormat.greenBits = TVar3;
    *(byte *)&renderTarget_local[2].m_pixelFormat.blueBits = dst_local->depthMask & 1;
  }
  if (((renderTarget_local->m_pixelFormat).alphaBits & 1) != 0) {
    translateStencilState
              ((StencilState *)(dst_local->stencilStates + 1),
               (StencilState *)&renderTarget_local[1].m_pixelFormat.blueBits);
    translateStencilState
              ((StencilState *)dst_local->stencilStates,
               (StencilState *)&renderTarget_local->m_depthBits);
  }
  if ((dst_local->field_0x59 & 1) != 0) {
    translateBlendState((BlendState *)&dst_local->blendMode,
                        (BlendState *)&renderTarget_local[2].m_depthBits);
    translateBlendState((BlendState *)&(dst_local->blendRGBState).dstFunc,
                        (BlendState *)(renderTarget_local + 3));
    pBVar1 = &dst_local->blendAState;
    tcu::Vector<float,_4>::Vector(&local_44,0.0);
    tcu::Vector<float,_4>::Vector(&local_54,1.0);
    tcu::clamp<float,4>((tcu *)&local_34,(Vector<float,_4> *)&pBVar1->dstFunc,&local_44,&local_54);
    renderTarget_local[3].m_pixelFormat.greenBits = (undefined4)local_34;
    renderTarget_local[3].m_pixelFormat.blueBits = local_34._4_4_;
    *(undefined8 *)&renderTarget_local[3].m_pixelFormat.alphaBits = local_2c;
  }
  return;
}

Assistant:

void translateState (const RenderState& src, rr::FragmentOperationState& dst, const tcu::RenderTarget& renderTarget)
{
	bool hasDepth		= renderTarget.getDepthBits() > 0;
	bool hasStencil		= renderTarget.getStencilBits() > 0;

	dst.scissorTestEnabled		= src.scissorTestEnabled;
	dst.scissorRectangle		= src.scissorRectangle;
	dst.stencilTestEnabled		= hasStencil && src.stencilTestEnabled;
	dst.depthTestEnabled		= hasDepth && src.depthTestEnabled;
	dst.blendMode				= src.blendEnabled ? rr::BLENDMODE_STANDARD : rr::BLENDMODE_NONE;
	dst.numStencilBits			= renderTarget.getStencilBits();

	dst.colorMask = src.colorMask;

	if (dst.depthTestEnabled)
	{
		dst.depthFunc	= sglr::rr_util::mapGLTestFunc(src.depthFunc);
		dst.depthMask	= src.depthWriteMask;
	}

	if (dst.stencilTestEnabled)
	{
		translateStencilState(src.stencil[rr::FACETYPE_BACK],	dst.stencilStates[rr::FACETYPE_BACK]);
		translateStencilState(src.stencil[rr::FACETYPE_FRONT],	dst.stencilStates[rr::FACETYPE_FRONT]);
	}

	if (src.blendEnabled)
	{
		translateBlendState(src.blendRGBState, dst.blendRGBState);
		translateBlendState(src.blendAState, dst.blendAState);
		dst.blendColor = tcu::clamp(src.blendColor, Vec4(0.0f), Vec4(1.0f));
	}
}